

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
tracing_layer::zeCommandListAppendQueryKernelTimestamps
          (ze_command_list_handle_t hCommandList,uint32_t numEvents,ze_event_handle_t *phEvents,
          void *dstptr,size_t *pOffsets,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  ulong uVar1;
  _func__ze_result_t__ze_command_list_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr_void_ptr_unsigned_long_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong *puVar5;
  _func_void__ze_command_list_append_query_kernel_timestamps_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var6;
  long lVar7;
  size_t i;
  ulong uVar8;
  uint32_t numEvents_local;
  ze_event_handle_t hSignalEvent_local;
  size_t *pOffsets_local;
  void *dstptr_local;
  ze_event_handle_t *phEvents_local;
  ze_command_list_handle_t hCommandList_local;
  ze_event_handle_t *local_108;
  ulong local_100;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a0;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_88;
  ze_command_list_append_query_kernel_timestamps_params_t tracerParams;
  
  local_100 = (ulong)numWaitEvents;
  if (DAT_00189410 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr_void_ptr_unsigned_long_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
       *)0x0) {
    _Var2 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_108 = phWaitEvents;
    numEvents_local = numEvents;
    hSignalEvent_local = hSignalEvent;
    pOffsets_local = pOffsets;
    dstptr_local = dstptr;
    phEvents_local = phEvents;
    hCommandList_local = hCommandList;
    pcVar3 = (char *)tracingInProgress();
    if (*pcVar3 == '\0') {
      puVar4 = (undefined1 *)tracingInProgress();
      *puVar4 = 1;
      tracerParams.phCommandList = &hCommandList_local;
      tracerParams.pnumEvents = &numEvents_local;
      tracerParams.pphEvents = &phEvents_local;
      tracerParams.pdstptr = &dstptr_local;
      tracerParams.ppOffsets = &pOffsets_local;
      tracerParams.phSignalEvent = &hSignalEvent_local;
      tracerParams.pnumWaitEvents = &numWaitEvents;
      tracerParams.pphWaitEvents = &phWaitEvents;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apiCallbackData.apiOrdinal =
           (_func_void__ze_command_list_append_query_kernel_timestamps_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
            *)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      puVar5 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar5 == (ulong *)0x0) {
        p_Var6 = (_func_void__ze_command_list_append_query_kernel_timestamps_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                  *)0x0;
      }
      else {
        lVar7 = 0xcb0;
        for (uVar8 = 0; p_Var6 = apiCallbackData.apiOrdinal, uVar8 < *puVar5; uVar8 = uVar8 + 1) {
          uVar1 = puVar5[1];
          prologCallback.current_api_callback =
               *(_func_void__ze_command_list_append_query_kernel_timestamps_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)((uVar1 - 0x9f8) + lVar7);
          p_Var6 = *(_func_void__ze_command_list_append_query_kernel_timestamps_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)((uVar1 - 0x3a0) + lVar7);
          prologCallback.pUserData = *(void **)(uVar1 + lVar7);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back(&apiCallbackData.prologCallbacks,&prologCallback);
          epilogCallback.pUserData = *(void **)(puVar5[1] + lVar7);
          epilogCallback.current_api_callback = p_Var6;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back(&apiCallbackData.epilogCallbacks,&epilogCallback);
          lVar7 = lVar7 + 0xcb8;
        }
      }
      zeApiPtr = DAT_00189410;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&local_88,&apiCallbackData.prologCallbacks);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&local_a0,&apiCallbackData.epilogCallbacks);
      _Var2 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,unsigned_int,_ze_event_handle_t**,void*,unsigned_long_const*,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t**),_ze_command_list_append_query_kernel_timestamps_params_t*,void(*)(_ze_command_list_append_query_kernel_timestamps_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_query_kernel_timestamps_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_query_kernel_timestamps_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_query_kernel_timestamps_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_query_kernel_timestamps_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,unsigned_int&,_ze_event_handle_t**&,void*&,unsigned_long_const*&,_ze_event_handle_t*&,unsigned_int&,_ze_event_handle_t**&>
                        (zeApiPtr,&tracerParams,p_Var6,
                         (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          *)&local_88,
                         (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          *)&local_a0,&hCommandList_local,&numEvents_local,&phEvents_local,
                         &dstptr_local,&pOffsets_local,&hSignalEvent_local,&numWaitEvents,
                         &phWaitEvents);
      std::
      _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~_Vector_base(&local_a0);
      std::
      _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~_Vector_base(&local_88);
      APITracerCallbackDataImp<void_(*)(_ze_command_list_append_query_kernel_timestamps_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp(&apiCallbackData);
    }
    else {
      _Var2 = (*DAT_00189410)(hCommandList,numEvents,phEvents,dstptr,pOffsets,hSignalEvent,
                              (uint)local_100,local_108);
    }
  }
  return _Var2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendQueryKernelTimestamps(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numEvents,                             ///< [in] the number of timestamp events to query
        ze_event_handle_t* phEvents,                    ///< [in][range(0, numEvents)] handles of timestamp events to query
        void* dstptr,                                   ///< [in,out] pointer to memory where ::ze_kernel_timestamp_result_t will
                                                        ///< be written; must be size-aligned.
        const size_t* pOffsets,                         ///< [in][optional][range(0, numEvents)] offset, in bytes, to write
                                                        ///< results; address must be 4byte-aligned and offsets must be
                                                        ///< size-aligned.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing query;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing query
        )
    {
        auto pfnAppendQueryKernelTimestamps = context.zeDdiTable.CommandList.pfnAppendQueryKernelTimestamps;

        if( nullptr == pfnAppendQueryKernelTimestamps)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnAppendQueryKernelTimestamps, hCommandList, numEvents, phEvents, dstptr, pOffsets, hSignalEvent, numWaitEvents, phWaitEvents);

        // capture parameters
        ze_command_list_append_query_kernel_timestamps_params_t tracerParams = {
            &hCommandList,
            &numEvents,
            &phEvents,
            &dstptr,
            &pOffsets,
            &hSignalEvent,
            &numWaitEvents,
            &phWaitEvents
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListAppendQueryKernelTimestampsCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListAppendQueryKernelTimestampsCb_t, CommandList, pfnAppendQueryKernelTimestampsCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnAppendQueryKernelTimestamps,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.pnumEvents,
                                                  *tracerParams.pphEvents,
                                                  *tracerParams.pdstptr,
                                                  *tracerParams.ppOffsets,
                                                  *tracerParams.phSignalEvent,
                                                  *tracerParams.pnumWaitEvents,
                                                  *tracerParams.pphWaitEvents);
    }